

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRStereoNode.cpp
# Opt level: O2

void __thiscall
MinVR::VRStereoNode::render
          (VRStereoNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  VRGraphicsToolkit *pVVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  VRAnyCoreType VVar6;
  undefined4 extraout_var;
  VRError *pVVar7;
  VREyePosition eye;
  float y;
  allocator<char> local_2f4;
  allocator<char> local_2f3;
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  string local_2f0;
  int local_2cc;
  string local_2c8;
  string local_2a8;
  undefined8 local_288;
  float local_280;
  float local_27c;
  VRRenderHandler *local_278;
  string local_270;
  VRString local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  VRString local_150;
  VRString local_130;
  VRString local_110;
  VRRect local_f0;
  VRRect local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  VRDataIndex::pushState(renderState);
  switch(this->_format) {
  case VRSTEREOFORMAT_MONO:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"StereoFormat",(allocator<char> *)&local_2a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"Mono",(allocator<char> *)&local_2c8);
    VRDataIndex::addData(&local_50,renderState,&local_2f0,&local_110);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_2f0);
    (**(code **)(*(long *)this->_gfxToolkit + 0x18))(this->_gfxToolkit,0);
    eye = Cyclops;
    break;
  case VRSTEREOFORMAT_QUADBUFFERED:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"StereoFormat",(allocator<char> *)&local_2a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"QuadBuffered",(allocator<char> *)&local_2c8);
    VRDataIndex::addData(&local_70,renderState,&local_2f0,&local_130);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_2f0);
    (**(code **)(*(long *)this->_gfxToolkit + 0x18))(this->_gfxToolkit,2);
    renderOneEye(this,renderState,renderHandler,Left);
    (**(code **)(*(long *)this->_gfxToolkit + 0x18))(this->_gfxToolkit,3);
    eye = Right;
    break;
  case VRSTEREOFORMAT_SIDEBYSIDE:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"StereoFormat",(allocator<char> *)&local_2a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"SideBySide",(allocator<char> *)&local_2c8);
    VRDataIndex::addData(&local_90,renderState,&local_2f0,&local_150);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"ViewportX",(allocator<char> *)&local_2a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"",(allocator<char> *)&local_2c8);
    bVar2 = VRDataIndex::exists(renderState,&local_2f0,&local_170,true);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_2f0);
    local_278 = renderHandler;
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"ViewportX",(allocator<char> *)&local_2a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"",(allocator<char> *)&local_2c8);
      VVar6 = VRDataIndex::getValue(renderState,&local_2f0,&local_190,true);
      iVar3 = (*(VVar6.datum)->_vptr_VRDatum[6])(VVar6.datum);
      local_288 = CONCAT44(extraout_var,iVar3);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"ViewportY",(allocator<char> *)&local_2a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"",(allocator<char> *)&local_2c8);
      VVar6 = VRDataIndex::getValue(renderState,&local_2f0,&local_1b0,true);
      iVar4 = (*(VVar6.datum)->_vptr_VRDatum[6])(VVar6.datum);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"ViewportWidth",(allocator<char> *)&local_2a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"",(allocator<char> *)&local_2c8);
      VVar6 = VRDataIndex::getValue(renderState,&local_2f0,&local_1d0,true);
      iVar3 = (*(VVar6.datum)->_vptr_VRDatum[6])(VVar6.datum);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"ViewportHeight",(allocator<char> *)&local_2a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,"",(allocator<char> *)&local_2c8);
      VVar6 = VRDataIndex::getValue(renderState,&local_2f0,&local_1f0,true);
      iVar5 = (*(VVar6.datum)->_vptr_VRDatum[6])(VVar6.datum);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      y = (float)iVar4;
      iVar4 = (int)local_288;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"WindowWidth",(allocator<char> *)&local_2a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"",(allocator<char> *)&local_2c8);
      bVar2 = VRDataIndex::exists(renderState,&local_2f0,&local_210,true);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_2f0);
      if (!bVar2) {
        pVVar7 = (VRError *)__cxa_allocate_exception(0xa8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,"VRStereoNode needs a window width.",&local_2f1);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"",&local_2f2);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/display/VRStereoNode.cpp"
                   ,&local_2f3);
        local_2cc = 0x44;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,
                   "virtual void MinVR::VRStereoNode::render(VRDataIndex *, VRRenderHandler *)",
                   &local_2f4);
        VRError::VRError(pVVar7,&local_2f0,&local_2a8,&local_2c8,&local_2cc,&local_270);
        __cxa_throw(pVVar7,&VRError::typeinfo,VRError::~VRError);
      }
      VVar6 = VRDataIndex::getValue(renderState);
      iVar3 = (*(VVar6.datum)->_vptr_VRDatum[6])(VVar6.datum);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"WindowHeight",(allocator<char> *)&local_2a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"",(allocator<char> *)&local_2c8);
      bVar2 = VRDataIndex::exists(renderState,&local_2f0,&local_230,true);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_2f0);
      if (!bVar2) {
        pVVar7 = (VRError *)__cxa_allocate_exception(0xa8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2f0,"VRStereoNode needs a window height.",&local_2f1);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"",&local_2f2);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/display/VRStereoNode.cpp"
                   ,&local_2f3);
        local_2cc = 0x4a;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,
                   "virtual void MinVR::VRStereoNode::render(VRDataIndex *, VRRenderHandler *)",
                   &local_2f4);
        VRError::VRError(pVVar7,&local_2f0,&local_2a8,&local_2c8,&local_2cc,&local_270);
        __cxa_throw(pVVar7,&VRError::typeinfo,VRError::~VRError);
      }
      VVar6 = VRDataIndex::getValue(renderState);
      iVar5 = (*(VVar6.datum)->_vptr_VRDatum[6])(VVar6.datum);
      y = 0.0;
      iVar4 = 0;
    }
    pVVar1 = this->_gfxToolkit;
    local_27c = (float)(iVar3 / 2);
    local_280 = (float)iVar5;
    local_288 = CONCAT44(local_288._4_4_,y);
    VRRect::VRRect(&local_d0,(float)iVar4,y,local_27c,local_280,false);
    (**(code **)(*(long *)pVVar1 + 0x20))(pVVar1,&local_d0);
    VRRect::~VRRect(&local_d0);
    renderHandler = local_278;
    renderOneEye(this,renderState,local_278,Left);
    pVVar1 = this->_gfxToolkit;
    VRRect::VRRect(&local_f0,(float)(iVar4 + iVar3 / 2 + 1),(float)local_288,local_27c,local_280,
                   false);
    (**(code **)(*(long *)pVVar1 + 0x20))(pVVar1,&local_f0);
    VRRect::~VRRect(&local_f0);
    eye = Right;
    break;
  case VRSTEREOFORMAT_COLUMNINTERLACED:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"StereoFormat",(allocator<char> *)&local_2a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"ColumnInterlaced",(allocator<char> *)&local_2c8);
    VRDataIndex::addData(&local_b0,renderState,&local_2f0,&local_250);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_2f0);
    (**(code **)(*(long *)this->_gfxToolkit + 0x30))();
    renderOneEye(this,renderState,renderHandler,Left);
    (**(code **)(*(long *)this->_gfxToolkit + 0x28))();
    renderOneEye(this,renderState,renderHandler,Right);
    (**(code **)(*(long *)this->_gfxToolkit + 0x38))();
  default:
    goto switchD_001337f6_default;
  }
  renderOneEye(this,renderState,renderHandler,eye);
switchD_001337f6_default:
  VRDataIndex::popState(renderState);
  return;
}

Assistant:

void VRStereoNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler) {
  renderState->pushState();

	if (_format == VRSTEREOFORMAT_MONO) {
		renderState->addData("StereoFormat", "Mono");

		_gfxToolkit->setDrawBuffer(VRGraphicsToolkit::VRDRAWBUFFER_BACK);
		renderOneEye(renderState, renderHandler, Cyclops);
	}
	else if (_format == VRSTEREOFORMAT_QUADBUFFERED) {
		renderState->addData("StereoFormat", "QuadBuffered");

		_gfxToolkit->setDrawBuffer(VRGraphicsToolkit::VRDRAWBUFFER_BACKLEFT);
		renderOneEye(renderState, renderHandler, Left);

		_gfxToolkit->setDrawBuffer(VRGraphicsToolkit::VRDRAWBUFFER_BACKRIGHT);
		renderOneEye(renderState, renderHandler, Right);
	}
	else if (_format == VRSTEREOFORMAT_SIDEBYSIDE) {
		renderState->addData("StereoFormat", "SideBySide");

		int x,y,w,h;
		if (renderState->exists("ViewportX")) {
      x = renderState->getValue("ViewportX");
      y = renderState->getValue("ViewportY");
			w = renderState->getValue("ViewportWidth");
			h = renderState->getValue("ViewportHeight");
		}
		else {
      x = 0;
      y = 0;
      if (renderState->exists("WindowWidth")) {
        w = renderState->getValue();
      } else {
        VRERRORNOADV("VRStereoNode needs a window width.");
      }

      if (renderState->exists("WindowHeight")) {
        h = renderState->getValue();
      } else {
        VRERRORNOADV("VRStereoNode needs a window height.");
      }
		}

		_gfxToolkit->setSubWindow(VRRect((float)x, (float)y, (float)(w/2), (float)h));
		renderOneEye(renderState, renderHandler, Left);

		_gfxToolkit->setSubWindow(VRRect((float)(x + w / 2 + 1), (float)y, (float)(w / 2), (float)h));
		renderOneEye(renderState, renderHandler, Right);
	}
	else if (_format == VRSTEREOFORMAT_COLUMNINTERLACED) {
		renderState->addData("StereoFormat", "ColumnInterlaced");

		_gfxToolkit->disableDrawingOnEvenColumns();
		renderOneEye(renderState, renderHandler, Left);

		_gfxToolkit->disableDrawingOnOddColumns();
		renderOneEye(renderState, renderHandler, Right);

		_gfxToolkit->enableDrawingOnAllColumns();
	}

	renderState->popState();
}